

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset_function.cc
# Opt level: O3

MatrixXd * __thiscall
projects::ipdg_stokes::assemble::PiecewiseBoundaryNormalJumpAssembler::Eval
          (MatrixXd *__return_storage_ptr__,PiecewiseBoundaryNormalJumpAssembler *this,
          Entity *entity)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined1 auVar3 [16];
  undefined8 lhs;
  undefined8 rhs;
  int iVar4;
  int iVar5;
  PointerType ptr;
  undefined4 extraout_var;
  ulong uVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Scalar *pSVar7;
  undefined8 *puVar8;
  double *pdVar9;
  long extraout_RDX;
  long extraout_RDX_00;
  ulong uVar10;
  int node_idx;
  long lVar11;
  long lVar12;
  long lVar13;
  int edge_idx;
  int iVar14;
  double __tmp;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  MatrixXd *elem_mat;
  MatrixXd grads;
  FeLagrangeO1Tria<double> hat_func;
  MatrixXd basis_funct;
  MatrixXd J_inv_trans;
  MatrixXd ref_grads;
  Matrix<double,_2,_3,_0,_2,_3> normals;
  undefined1 local_2f8 [16];
  long local_2e8;
  int local_2d4;
  long local_2d0;
  XprTypeNested local_2c8;
  undefined8 uStack_2c0;
  Scalar local_2b8;
  FeLagrangeO1Tria<double> local_2b0;
  Scalar *local_2a8;
  double local_2a0;
  undefined1 local_298 [16];
  Index local_288;
  undefined1 local_278 [24];
  double *local_260;
  Index local_250;
  Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>_>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
  local_248;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  variable_if_dynamic<long,__1> local_1b8;
  long lStack_1b0;
  double *local_1a8;
  XprTypeNested local_190;
  undefined1 local_160 [16];
  scalar_constant_op<double> local_150;
  XprTypeNested pMStack_148;
  variable_if_dynamic<long,__1> local_140;
  variable_if_dynamic<long,__1> vStack_138;
  double *local_130;
  Lhs local_128;
  Rhs local_110;
  Lhs local_f8;
  Lhs local_c8;
  Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true> local_98;
  Matrix<double,_2,_3,_0,_2,_3> local_68;
  
  local_1c8._8_8_ = local_1c8._0_8_;
  ipdg_stokes::mesh::computeOutwardNormals(&local_68,entity);
  iVar4 = (*entity->_vptr_Entity[3])(entity);
  local_2b0.super_ScalarReferenceFiniteElement<double>._vptr_ScalarReferenceFiniteElement =
       (ScalarReferenceFiniteElement<double>)&PTR__ScalarReferenceFiniteElement_003ec218;
  local_160._0_8_ = 2;
  local_150.m_other = 0.0;
  local_248.m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0> =
       (MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>)0x0;
  local_248.m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.m_xpr =
       (XprTypeNested)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_248,2,1);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_248,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_160,(assign_op<double,_double> *)&local_f8);
  lVar11 = (long)local_248.m_lhs.m_matrix.
                 super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>
                 .m_xpr *
           local_248.m_lhs.m_matrix.
           super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>.
           _8_8_;
  uVar6 = lVar11 - (lVar11 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar11) {
    lVar13 = 0;
    do {
      *(undefined1 (*) [16])
       (local_248.m_lhs.m_matrix.
        super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>.
        m_data + lVar13) = (undefined1  [16])0x0;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar6);
  }
  auVar3 = _DAT_00359090;
  auVar1 = _DAT_00359080;
  lVar13 = lVar11 % 2;
  if (lVar13 != 0 && (long)uVar6 <= lVar11) {
    lVar12 = lVar13 + -1;
    auVar15._8_4_ = (int)lVar12;
    auVar15._0_8_ = lVar12;
    auVar15._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar6 = 0;
    auVar15 = auVar15 ^ _DAT_00359090;
    do {
      auVar18._8_4_ = (int)uVar6;
      auVar18._0_8_ = uVar6;
      auVar18._12_4_ = (int)(uVar6 >> 0x20);
      auVar18 = (auVar18 | auVar1) ^ auVar3;
      bVar2 = auVar15._0_4_ < auVar18._0_4_;
      iVar14 = auVar15._4_4_;
      iVar5 = auVar18._4_4_;
      if ((bool)(~(iVar14 < iVar5 || iVar5 == iVar14 && bVar2) & 1)) {
        (local_248.m_lhs.m_matrix.
         super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>.
         m_data + (lVar11 / 2) * 2)[uVar6] = 0.0;
      }
      if (iVar14 >= iVar5 && (iVar5 != iVar14 || !bVar2)) {
        (local_248.m_lhs.m_matrix.
         super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>.
         m_data + (lVar11 / 2) * 2)[uVar6 + 1] = 0.0;
      }
      uVar6 = uVar6 + 2;
    } while ((lVar13 + 1U & 0xfffffffffffffffe) != uVar6);
  }
  lf::uscalfe::FeLagrangeO1Tria<double>::GradientsReferenceShapeFunctions
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_1d8,&local_2b0,(MatrixXd *)&local_248);
  local_278._0_8_ = (Matrix<double,__1,__1,_0,__1,__1> *)local_1d8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_110,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)local_278);
  free((void *)local_1d8._0_8_);
  free(local_248.m_lhs.m_matrix.
       super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>.m_data
      );
  local_248.m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>.m_data =
       (PointerType)0x2;
  local_248.m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.m_xpr =
       (XprTypeNested)0x0;
  local_1d8._0_8_ = (LhsNested)0x0;
  local_1d8._8_8_ = (RhsNested)0x0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_1c8._8_8_;
  local_1c8 = auVar1 << 0x40;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1d8,2,1);
  local_2c8 = local_248.m_lhs.m_matrix.
              super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
              m_xpr;
  uStack_2c0 = 0;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_1d8,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_248,(assign_op<double,_double> *)local_160);
  lVar11 = local_1c8._0_8_ * local_1d8._8_8_;
  uVar6 = lVar11 - (lVar11 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar11) {
    lVar13 = 0;
    do {
      pdVar9 = (double *)(local_1d8._0_8_ + lVar13 * 8);
      *pdVar9 = (double)local_2c8;
      pdVar9[1] = (double)local_2c8;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar6);
  }
  auVar3 = _DAT_00359090;
  auVar1 = _DAT_00359080;
  lVar13 = lVar11 % 2;
  if (lVar13 != 0 && (long)uVar6 <= lVar11) {
    lVar12 = lVar13 + -1;
    auVar16._8_4_ = (int)lVar12;
    auVar16._0_8_ = lVar12;
    auVar16._12_4_ = (int)((ulong)lVar12 >> 0x20);
    pdVar9 = (double *)(local_1d8._0_8_ + (lVar11 / 2) * 0x10);
    uVar6 = 0;
    auVar16 = auVar16 ^ _DAT_00359090;
    do {
      auVar19._8_4_ = (int)uVar6;
      auVar19._0_8_ = uVar6;
      auVar19._12_4_ = (int)(uVar6 >> 0x20);
      auVar15 = (auVar19 | auVar1) ^ auVar3;
      bVar2 = auVar16._0_4_ < auVar15._0_4_;
      iVar14 = auVar16._4_4_;
      iVar5 = auVar15._4_4_;
      if ((bool)(~(iVar14 < iVar5 || iVar5 == iVar14 && bVar2) & 1)) {
        pdVar9[uVar6] = (double)local_2c8;
      }
      if (iVar14 >= iVar5 && (iVar5 != iVar14 || !bVar2)) {
        pdVar9[uVar6 + 1] = (double)local_2c8;
      }
      uVar6 = uVar6 + 2;
    } while ((lVar13 + 1U & 0xfffffffffffffffe) != uVar6);
  }
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x28))
            (&local_128,(long *)CONCAT44(extraout_var,iVar4),local_1d8);
  free((void *)local_1d8._0_8_);
  Eigen::
  Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
  Product((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
           *)local_1d8,&local_128,&local_110);
  lhs = local_1d8._0_8_;
  rhs = local_1d8._8_8_;
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = 0;
  lVar11 = *(Index *)(local_1d8._0_8_ + 8);
  lVar13 = *(Index *)(local_1d8._8_8_ + 0x10);
  if ((lVar13 != 0 && lVar11 != 0) &&
     (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar1 / SEXT816(lVar13),0) < lVar11)) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8,lVar11,SUB168(auVar1 % SEXT816(lVar13),0));
    *puVar8 = &std::out_of_range::vtable;
    __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2f8,lVar11,lVar13);
  lVar11 = *(Index *)(lhs + 8);
  lVar13 = *(Index *)(rhs + 0x10);
  if ((local_2f8._8_8_ != lVar11) || (local_2e8 != lVar13)) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2f8,lVar11,lVar13
              );
  }
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_2f8,(Matrix<double,__1,__1,_0,__1,__1> *)lhs
             ,(Matrix<double,__1,__1,_0,__1,__1> *)rhs);
  local_298 = (undefined1  [16])0x0;
  local_288 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_298,2,3);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&local_248,
             (Matrix<double,__1,__1,_0,__1,__1> *)local_2f8,1);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_278,
             (Matrix<double,__1,__1,_0,__1,__1> *)local_298,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&local_248);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_160,
             (Matrix<double,__1,__1,_0,__1,__1> *)local_2f8,0);
  local_1a8 = local_130;
  local_1c8._8_8_ = pMStack_148;
  local_1c8._0_8_ = local_150.m_other;
  local_1b8.m_value = local_140.m_value;
  lStack_1b0 = vStack_138.m_value;
  local_1d8._8_8_ = local_160._8_8_;
  local_1d8._0_8_ = local_160._0_8_;
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_278,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)local_1d8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_278);
  iVar4 = (*entity->_vptr_Entity[1])(entity,2);
  local_2d0 = CONCAT44(extraout_var_00,iVar4);
  iVar4 = (*entity->_vptr_Entity[1])(entity,1);
  local_2c8 = (XprTypeNested)CONCAT44(extraout_var_01,iVar4);
  iVar4 = 0;
  iVar14 = 0;
  if (extraout_RDX != 0) {
    lVar11 = 0;
    iVar14 = 0;
    do {
      iVar5 = (**this->boundary_->_vptr_MeshDataSet)
                        (this->boundary_,*(undefined8 *)(local_2d0 + lVar11));
      iVar14 = iVar14 + (uint)*(byte *)CONCAT44(extraout_var_02,iVar5);
      lVar11 = lVar11 + 8;
    } while (extraout_RDX << 3 != lVar11);
  }
  if (extraout_RDX_00 != 0) {
    lVar11 = 0;
    iVar4 = 0;
    do {
      iVar5 = (**this->boundary_->_vptr_MeshDataSet)
                        (this->boundary_,*(undefined8 *)((long)local_2c8 + lVar11));
      iVar4 = iVar4 + (uint)*(byte *)CONCAT44(extraout_var_03,iVar5);
      lVar11 = lVar11 + 8;
    } while (extraout_RDX_00 << 3 != lVar11);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_248.m_lhs.m_matrix.
                 super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>
                 .
                 super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>
                 ._8_8_;
  local_248.m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0> =
       (MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>)
       (auVar3 << 0x40);
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_1d8,(ulong)(iVar4 + (uint)(iVar4 == 0)),
                   (ulong)(iVar14 + (uint)(iVar14 == 0)),(scalar_constant_op<double> *)&local_248);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  if (((RhsNested)local_1d8._8_8_ != (RhsNested)0x0 && (LhsNested)local_1d8._0_8_ != (LhsNested)0x0)
     && (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
        SUB168(auVar1 / SEXT816((long)local_1d8._8_8_),0) < (long)local_1d8._0_8_)) {
    puVar8 = (undefined8 *)
             __cxa_allocate_exception
                       (8,local_1d8._0_8_,SUB168(auVar1 % SEXT816((long)local_1d8._8_8_),0));
    *puVar8 = &std::out_of_range::vtable;
    __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,local_1d8._0_8_,
             local_1d8._8_8_);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,double,double>
            (__return_storage_ptr__,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_1d8,(assign_op<double,_double> *)&local_248);
  auVar3 = _DAT_00359090;
  auVar1 = _DAT_00359080;
  lVar11 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_rows *
           (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_cols;
  if (0 < lVar11) {
    pdVar9 = (__return_storage_ptr__->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    uVar6 = lVar11 + 0x1fffffffffffffff;
    uVar10 = uVar6 & 0x1fffffffffffffff;
    auVar17._8_4_ = (int)uVar10;
    auVar17._0_8_ = uVar10;
    auVar17._12_4_ = (int)(uVar10 >> 0x20);
    lVar11 = 0;
    auVar17 = auVar17 ^ _DAT_00359090;
    do {
      auVar20._8_4_ = (int)lVar11;
      auVar20._0_8_ = lVar11;
      auVar20._12_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar15 = (auVar20 | auVar1) ^ auVar3;
      if ((bool)(~(auVar15._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar15._0_4_ ||
                  auVar17._4_4_ < auVar15._4_4_) & 1)) {
        pdVar9[lVar11] = (double)local_1c8._0_8_;
      }
      if ((auVar15._12_4_ != auVar17._12_4_ || auVar15._8_4_ <= auVar17._8_4_) &&
          auVar15._12_4_ <= auVar17._12_4_) {
        pdVar9[lVar11 + 1] = (double)local_1c8._0_8_;
      }
      lVar11 = lVar11 + 2;
    } while ((uVar10 - ((uint)uVar6 & 1)) + 2 != lVar11);
  }
  lVar11 = 0;
  iVar4 = 0;
  do {
    iVar14 = (**this->boundary_->_vptr_MeshDataSet)
                       (this->boundary_,*(undefined8 *)(local_2d0 + lVar11 * 8));
    if (*(char *)CONCAT44(extraout_var_04,iVar14) == '\x01') {
      lVar13 = 0;
      iVar14 = 0;
      local_2d4 = iVar4;
      do {
        iVar5 = (**this->boundary_->_vptr_MeshDataSet)
                          (this->boundary_,*(undefined8 *)((long)local_2c8 + lVar13 * 8));
        if (*(char *)CONCAT44(extraout_var_05,iVar5) == '\x01') {
          Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>::Block
                    (&local_98,&local_68,lVar13);
          local_c8.m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
          m_startCol.m_value =
               local_98.
               super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
               .super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
               m_startCol.m_value;
          local_c8.m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
          m_outerStride =
               local_98.
               super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
               .super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
               m_outerStride;
          local_c8.m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.m_xpr
               = local_98.
                 super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>
                 .m_xpr;
          local_c8.m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
          m_startRow.m_value =
               local_98.
               super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
               .super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
               m_startRow.m_value;
          local_c8.m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>.
          m_data = local_98.
                   super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>
                   .
                   super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>
                   .m_data;
          local_c8.m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>.
          _8_8_ = local_98.
                  super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>
                  ._8_8_;
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_160,
                     (Matrix<double,__1,__1,_0,__1,__1> *)local_298,lVar11);
          Eigen::
          Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>_>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>
          ::Product(&local_248,&local_c8,
                    (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_160);
          local_2a8 = &local_2a0;
          local_f8.m_matrix.m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
          m_startCol.m_value =
               local_248.m_lhs.m_matrix.
               super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
               .super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
               m_startCol.m_value;
          local_f8.m_matrix.m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
          m_outerStride =
               local_248.m_lhs.m_matrix.
               super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
               .super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
               m_outerStride;
          local_f8.m_matrix.m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.m_xpr
               = local_248.m_lhs.m_matrix.
                 super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>
                 .m_xpr;
          local_f8.m_matrix.m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
          m_startRow.m_value =
               local_248.m_lhs.m_matrix.
               super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
               .super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
               m_startRow.m_value;
          local_f8.m_matrix.m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>.
          m_data = local_248.m_lhs.m_matrix.
                   super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>
                   .
                   super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>
                   .m_data;
          local_f8.m_matrix.m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>.
          _8_8_ = local_248.m_lhs.m_matrix.
                  super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>
                  ._8_8_;
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>_>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
          ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>_>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                           *)local_1d8,&local_f8,&local_248.m_rhs,
                          (scalar_product_op<double,_double> *)local_278);
          Eigen::internal::
          block_evaluator<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>::
          block_evaluator((block_evaluator<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>
                           *)(local_278 + 8),(XprType *)local_1d8);
          local_260 = local_1a8;
          local_250 = (local_190->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows;
          local_2a0 = local_1a8[1] * *(double *)(local_278._8_8_ + 8) +
                      *local_1a8 * *(double *)local_278._8_8_;
          local_2b8 = *local_2a8;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                              __return_storage_ptr__,(long)iVar14,(long)iVar4);
          *pSVar7 = local_2b8;
          iVar14 = iVar14 + 1;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      iVar4 = local_2d4 + 1;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  free((void *)local_298._0_8_);
  free((void *)local_2f8._0_8_);
  free(local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_110.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd PiecewiseBoundaryNormalJumpAssembler::Eval(
    const lf::mesh::Entity &entity) const {
  // Use the vertex coordinates to compute the local normals on the edges
  const Eigen::Matrix<double, 2, 3> normals =
      projects::ipdg_stokes::mesh::computeOutwardNormals(entity);
  // Construct the basis functions from the curl of the standard hat functions
  const auto *geom = entity.Geometry();
  const lf::uscalfe::FeLagrangeO1Tria<double> hat_func;
  const Eigen::MatrixXd ref_grads =
      hat_func.GradientsReferenceShapeFunctions(Eigen::VectorXd::Zero(2))
          .transpose();
  const Eigen::MatrixXd J_inv_trans =
      geom->JacobianInverseGramian(Eigen::VectorXd::Zero(2));
  const Eigen::MatrixXd grads = J_inv_trans * ref_grads;
  Eigen::MatrixXd basis_funct(2, 3);
  basis_funct << grads.row(1), -grads.row(0);
  const auto nodes = entity.SubEntities(2);
  const auto edges = entity.SubEntities(1);
  // Count the number of boundary nodes and edges belonging to this triangle
  // to get the size of the element matrix
  int boundary_node_count = 0;
  int boundary_edge_count = 0;
  for (const auto *const node : nodes) {
    if (boundary_(*node)) {
      ++boundary_node_count;
    }
  }
  for (const auto *const edge : edges) {
    if (boundary_(*edge)) {
      ++boundary_edge_count;
    }
  }
  // Assemble the element matrix itself
  Eigen::MatrixXd elem_mat = Eigen::MatrixXd::Zero(
      std::max(1, boundary_edge_count), std::max(1, boundary_node_count));
  int col_idx = 0;
  for (int node_idx = 0; node_idx < 3; ++node_idx) {
    int row_idx = 0;
    const auto &node = *nodes[node_idx];
    if (boundary_(node)) {
      for (int edge_idx = 0; edge_idx < 3; ++edge_idx) {
        const auto &edge = *edges[edge_idx];
        if (boundary_(edge)) {
          elem_mat(row_idx, col_idx) =
              normals.col(edge_idx).transpose() * basis_funct.col(node_idx);
          ++row_idx;
        }
      }
      ++col_idx;
    }
  }
  return elem_mat;
}